

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool rw::findChunk(Stream *s,uint32 type,uint32 *length,uint32 *version)

{
  bool bVar1;
  ChunkHeaderInfo header;
  
  while( true ) {
    bVar1 = readChunkHeaderInfo(s,&header);
    if ((!bVar1) || (header.type == 0)) {
      return false;
    }
    if (header.type == type) break;
    (*s->_vptr_Stream[5])(s,(ulong)header.length,1);
  }
  if (length != (uint32 *)0x0) {
    *length = header.length;
  }
  if (version == (uint32 *)0x0) {
    return true;
  }
  *version = header.version;
  return true;
}

Assistant:

bool
findChunk(Stream *s, uint32 type, uint32 *length, uint32 *version)
{
	ChunkHeaderInfo header;
	while(readChunkHeaderInfo(s, &header)){
		if(header.type == ID_NAOBJECT)
			return false;
		if(header.type == type){
			if(length)
				*length = header.length;
			if(version)
				*version = header.version;
			return true;
		}
		s->seek(header.length);
	}
	return false;
}